

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O0

void __thiscall
UnitTests::Assert::Equals<std::__cxx11::string,std::__cxx11::string>
          (Assert *this,string *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *expected,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  string local_278 [32];
  string local_258 [32];
  expected_got_outputter_with_coercion<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_238;
  string local_228 [32];
  expected_got_outputter_with_coercion<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_208;
  expected_got_outputter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f8;
  ostringstream local_1f0 [8];
  ostringstream s;
  string local_68 [32];
  string local_48 [32];
  string *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *expected_local;
  string *msg_local;
  Assert *this_local;
  
  local_28 = (string *)actual;
  actual_local = expected;
  expected_local = msg;
  msg_local = (string *)this;
  std::__cxx11::string::string(local_48,(string *)expected);
  std::__cxx11::string::string(local_68,local_28);
  bVar1 = are_equal<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_48);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_1f0);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    local_1f8 = stream<std::__cxx11::string>(expected_local);
    poVar3 = details::operator<<((ostream *)local_1f0,&local_1f8);
    std::operator<<(poVar3," ");
  }
  poVar3 = (ostream *)std::ostream::operator<<(local_1f0,std::boolalpha);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)local_1f0,"    Expected <");
  std::__cxx11::string::string(local_228,(string *)actual_local);
  local_208 = stream_with_coercion<std::__cxx11::string,std::__cxx11::string>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_228,actual_local);
  poVar3 = details::operator<<(poVar3,&local_208);
  std::operator<<(poVar3,">\n");
  std::__cxx11::string::~string(local_228);
  poVar3 = std::operator<<((ostream *)local_1f0,"     but got <");
  std::__cxx11::string::string(local_258,local_28);
  local_238 = stream_with_coercion<std::__cxx11::string,std::__cxx11::string>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_258,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_28);
  poVar3 = details::operator<<(poVar3,&local_238);
  std::operator<<(poVar3,">\n");
  std::__cxx11::string::~string(local_258);
  std::operator<<((ostream *)local_1f0,"  ");
  std::__cxx11::ostringstream::str();
  Error(this,local_278);
}

Assistant:

void Equals(const std::string& msg, const T& expected, const U& actual) const
        {
            if (!are_equal(std::common_type_t<T, U>(expected), std::common_type_t<T, U>(actual)))
            {
                auto s = std::ostringstream{};
                if (!msg.empty())
                    s << stream(msg) << " ";

                s << std::boolalpha << "\n";
                s << "    Expected <" << stream_with_coercion(std::common_type_t<T, U>(expected), expected) << ">\n";
                s << "     but got <" << stream_with_coercion(std::common_type_t<T, U>(actual), actual) << ">\n";
                s << "  ";
                Error(s.str());
            }
        }